

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void __thiscall
tcu::TextureLevelPyramid::TextureLevelPyramid(TextureLevelPyramid *this,TextureLevelPyramid *other)

{
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  *this_00;
  int iVar1;
  pointer pAVar2;
  TextureFormat format;
  int iVar3;
  long lVar4;
  long lVar5;
  pointer pPVar6;
  long lVar7;
  allocator_type local_5a;
  allocator_type local_59;
  int local_58;
  undefined4 local_54;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *local_50;
  TextureLevelPyramid *local_48;
  TextureLevelPyramid *local_40;
  undefined8 local_38;
  
  this->m_format = other->m_format;
  this_00 = &this->m_data;
  std::
  vector<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ::vector(this_00,(long)((int)((ulong)((long)(other->m_access).
                                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)(other->m_access).
                                             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x33333333),&local_59);
  local_50 = &this->m_access;
  local_48 = this;
  std::vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>::vector
            (local_50,(long)((int)((ulong)((long)(other->m_access).
                                                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)(other->m_access).
                                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                                ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                            -0x33333333),&local_5a);
  pPVar6 = (other->m_access).
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(other->m_access).
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6) >> 3) *
          -0x33333333) {
    lVar4 = 0x10;
    lVar7 = 0;
    lVar5 = 0;
    local_40 = other;
    do {
      pAVar2 = (other->m_data).
               super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&pAVar2->m_cap + lVar7) != 0) {
        de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
                  ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)
                   ((long)&((this_00->
                            super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                            )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7),
                   (ArrayBuffer<unsigned_char,_1UL,_1UL> *)((long)&pAVar2->m_ptr + lVar7));
        iVar1 = *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                        lVar4 + 0xfffffffffffffff0U);
        local_58 = *(int *)((long)(&(pPVar6->super_ConstPixelBufferAccess).m_size +
                                  0xffffffffffffffff) + lVar4);
        local_54 = *(undefined4 *)
                    ((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + -8);
        local_38 = *(undefined8 *)
                    ((long)&((this_00->
                             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar7);
        format = *(TextureFormat *)
                  ((long)(&(pPVar6->super_ConstPixelBufferAccess).m_size + 0xfffffffffffffffe) +
                  lVar4);
        iVar3 = getPixelSize(format);
        pPVar6 = (local_50->
                 super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(TextureFormat *)
         ((long)(&(pPVar6->super_ConstPixelBufferAccess).m_size + 0xfffffffffffffffe) + lVar4) =
             format;
        *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                lVar4 + 0xfffffffffffffff0U) = iVar1;
        *(int *)((long)(&(pPVar6->super_ConstPixelBufferAccess).m_size + 0xffffffffffffffff) + lVar4
                ) = local_58;
        *(undefined4 *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + -8) =
             local_54;
        *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data +
                lVar4 + 0xfffffffffffffffcU) = iVar3;
        iVar3 = iVar3 * iVar1;
        *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data + lVar4) = iVar3;
        *(int *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + 4U) =
             iVar3 * local_58;
        *(undefined8 *)((long)(pPVar6->super_ConstPixelBufferAccess).m_size.m_data + lVar4 + 8U) =
             local_38;
        other = local_40;
      }
      lVar5 = lVar5 + 1;
      pPVar6 = (other->m_access).
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < (int)((ulong)((long)(other->m_access).
                                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar6)
                          >> 3) * -0x33333333);
  }
  return;
}

Assistant:

TextureLevelPyramid::TextureLevelPyramid (const TextureLevelPyramid& other)
	: m_format	(other.m_format)
	, m_data	(other.getNumLevels())
	, m_access	(other.getNumLevels())
{
	for (int levelNdx = 0; levelNdx < other.getNumLevels(); levelNdx++)
	{
		if (!other.isLevelEmpty(levelNdx))
		{
			const tcu::ConstPixelBufferAccess& srcLevel = other.getLevel(levelNdx);

			m_data[levelNdx] = other.m_data[levelNdx];
			m_access[levelNdx] = PixelBufferAccess(srcLevel.getFormat(), srcLevel.getWidth(), srcLevel.getHeight(), srcLevel.getDepth(), m_data[levelNdx].getPtr());
		}
	}
}